

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O0

Expression * __thiscall duckdb::BoundLimitNode::GetValueExpression(BoundLimitNode *this)

{
  LimitNodeType LVar1;
  string *msg;
  type pEVar2;
  BoundLimitNode *in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffffb0;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  LVar1 = Type(in_RDI);
  if (LVar1 != EXPRESSION_VALUE) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &local_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,
               "BoundLimitNode::GetValueExpression called but limit is not an expression value",
               this_00);
    InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (in_stack_ffffffffffffffb0);
  return pEVar2;
}

Assistant:

const Expression &BoundLimitNode::GetValueExpression() const {
	if (Type() != LimitNodeType::EXPRESSION_VALUE) {
		throw InternalException("BoundLimitNode::GetValueExpression called but limit is not an expression value");
	}
	return *expression;
}